

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O2

void __thiscall FCELTexture::MakeTexture(FCELTexture *this)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *src;
  BYTE BVar3;
  BYTE *dst;
  long lVar4;
  byte *pbVar5;
  BYTE palette [256];
  CELPalette celPalette;
  BYTE local_428 [258];
  byte local_326 [766];
  
  anon_unknown.dwarf_842773::LoadCELLump
            ((this->super_FTexture).SourceLump,(CELPalette *)(local_428 + 0x100),&this->m_pixels);
  pbVar5 = local_326;
  for (lVar4 = 0; lVar4 != 0xff; lVar4 = lVar4 + 1) {
    BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)pbVar5[-2],(uint)pbVar5[-1],(uint)*pbVar5);
    local_428[lVar4] = BVar3;
    pbVar5 = pbVar5 + 3;
  }
  local_428[0xff] = 0;
  src = this->m_pixels;
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  dst = (BYTE *)operator_new__((ulong)uVar2 * (ulong)uVar1);
  this->m_pixels = dst;
  FTexture::FlipNonSquareBlockRemap(dst,src,(uint)uVar1,(uint)uVar2,(uint)uVar1,local_428);
  if (src != (BYTE *)0x0) {
    operator_delete__(src);
  }
  return;
}

Assistant:

void FCELTexture::MakeTexture()
{
	CELPalette celPalette;

	LoadCELLump(SourceLump, celPalette, m_pixels);

	BYTE palette[256];

	for (size_t i = 0; i < 255; ++i)
	{
		const BYTE* const color = &celPalette[3 * i];
		palette[i] = ColorMatcher.Pick(color[0], color[1], color[2]);
	}

	// The last palette entry is an alpha mask
	palette[255] = 0;

	const BYTE* const oldPixels = m_pixels;

	m_pixels = new BYTE[Width * Height];
	FlipNonSquareBlockRemap(m_pixels, oldPixels, Width, Height, Width, palette);

	delete[] oldPixels;
}